

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
          (Id<mathiu::impl::Product> *this,Product *v)

{
  bool bVar1;
  Product *lhs;
  IdBlockBase<mathiu::impl::Product> *this_00;
  ValueVariant<mathiu::impl::Product> *pVVar2;
  Product *v_local;
  Id<mathiu::impl::Product> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<mathiu::impl::Product>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<mathiu::impl::Product>;
    pVVar2 = IdBlockBase<mathiu::impl::Product>::variant(this_00);
    IdUtil<mathiu::impl::Product>::bindValue<mathiu::impl::Product_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }